

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpersTest.cpp
# Opt level: O0

void __thiscall Trim_VariousFilters_Test::Trim_VariousFilters_Test(Trim_VariousFilters_Test *this)

{
  Trim_VariousFilters_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Trim_VariousFilters_Test_00192080;
  return;
}

Assistant:

TEST(Trim, VariousFilters) {
    std::string s1{"  sdlfkj sdflk sd s  "};
    std::string a1{"sdlfkj sdflk sd s"};
    CLI::detail::trim(s1, " ");
    EXPECT_EQ(a1, s1);

    std::string s2{" a \t"};
    CLI::detail::trim(s2, " ");
    EXPECT_EQ("a \t", s2);

    std::string s3{"abdavda"};
    CLI::detail::trim(s3, "a");
    EXPECT_EQ("bdavd", s3);

    std::string s4{"abcabcabc"};
    EXPECT_EQ("cabcabc", CLI::detail::trim(s4, "ab"));
}